

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ForLoopStatementSyntax::getChild(ForLoopStatementSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  undefined8 in_RDX;
  long in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff48;
  TokenOrSyntax *in_stack_ffffffffffffff50;
  nullptr_t in_stack_ffffffffffffff58;
  Info *in_stack_ffffffffffffff60;
  
  switch(in_RDX) {
  case 0:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    break;
  case 1:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    break;
  case 2:
    token.info = in_stack_ffffffffffffff60;
    token._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token);
    break;
  case 3:
    token_00.info = in_stack_ffffffffffffff60;
    token_00._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token_00);
    break;
  case 4:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    break;
  case 5:
    token_01.info = in_stack_ffffffffffffff60;
    token_01._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token_01);
    break;
  case 6:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    break;
  case 7:
    token_02.info = in_stack_ffffffffffffff60;
    token_02._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token_02);
    break;
  case 8:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0xd8),in_stack_ffffffffffffff48);
    break;
  case 9:
    token_03.info = in_stack_ffffffffffffff60;
    token_03._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token_03);
    break;
  case 10:
    not_null<slang::syntax::StatementSyntax_*>::get
              ((not_null<slang::syntax::StatementSyntax_*> *)(in_RSI + 0x120));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax
              ((TokenOrSyntax *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax ForLoopStatementSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return forKeyword;
        case 3: return openParen;
        case 4: return &initializers;
        case 5: return semi1;
        case 6: return stopExpr;
        case 7: return semi2;
        case 8: return &steps;
        case 9: return closeParen;
        case 10: return statement.get();
        default: return nullptr;
    }
}